

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int send_resumption_token(quicly_conn_t *conn,quicly_send_context_t *s)

{
  ptls_iovec_t token_00;
  uint8_t *puVar1;
  size_t in_RSI;
  quicly_sent_t **in_RDI;
  ptls_iovec_t pVar2;
  int ret;
  quicly_sent_t *sent;
  uint8_t tokenbuf_small [128];
  ptls_buffer_t tokenbuf;
  quicly_address_token_plaintext_t token;
  quicly_sent_acked_cb in_stack_fffffffffffffa58;
  ptls_buffer_t *in_stack_fffffffffffffa60;
  quicly_sent_t **sent_00;
  size_t min_space;
  undefined1 in_stack_fffffffffffffa70 [16];
  ptls_buffer_t *in_stack_fffffffffffffa80;
  undefined4 local_570 [2];
  undefined8 local_568;
  int local_314;
  long local_310;
  void *local_288 [2];
  ulong local_278;
  undefined1 local_268 [44];
  quicly_sent_t *local_23c;
  quicly_sent_t *local_234;
  quicly_sent_t *local_22c;
  undefined4 local_224;
  size_t local_10;
  quicly_sent_t **local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  ptls_buffer_init(in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,0x1448b1);
  memset(local_570,0,600);
  local_570[0] = 1;
  local_568 = (*(code *)**(undefined8 **)((long)&(*local_8)[6].data + 8))
                        ((*local_8)[6].data.packet.sent_at);
  memcpy(local_268,local_570,600);
  local_23c = local_8[0x4a];
  local_234 = local_8[0x4b];
  local_22c = local_8[0x4c];
  local_224 = *(undefined4 *)(local_8 + 0x4d);
  local_314 = (**(code **)(*local_8)[7].acked)((*local_8)[7].acked,local_8,local_288,local_268);
  if (local_314 == 0) {
    if (599 < local_278) {
      __assert_fail("tokenbuf.off < QUICLY_MIN_CLIENT_INITIAL_SIZE / 2 && \"this is a ballpark figure, but tokens ought to be small\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                    ,0xecb,"int send_resumption_token(quicly_conn_t *, quicly_send_context_t *)");
    }
    sent_00 = local_8;
    min_space = local_10;
    pVar2 = ptls_iovec_init(local_288[0],local_278);
    in_stack_fffffffffffffa80 = (ptls_buffer_t *)pVar2.base;
    pVar2.len = (size_t)sent_00;
    pVar2.base = (uint8_t *)in_stack_fffffffffffffa58;
    quicly_new_token_frame_capacity(pVar2);
    local_314 = allocate_ack_eliciting_frame
                          (in_stack_fffffffffffffa70._8_8_,in_stack_fffffffffffffa70._0_8_,min_space
                           ,sent_00,in_stack_fffffffffffffa58);
    if (local_314 == 0) {
      *(int *)(local_8 + 0xe2) = *(int *)(local_8 + 0xe2) + 1;
      *(undefined4 *)(local_310 + 8) = 1;
      *(quicly_sent_t **)(local_310 + 0x10) = local_8[0xe0];
      puVar1 = *(uint8_t **)(local_10 + 0x58);
      ptls_iovec_init(local_288[0],local_278);
      token_00.len = (size_t)sent_00;
      token_00.base = puVar1;
      puVar1 = quicly_encode_new_token_frame((uint8_t *)0x144ad7,token_00);
      *(uint8_t **)(local_10 + 0x58) = puVar1;
      *(byte *)((long)local_8 + 0x7bc) = *(byte *)((long)local_8 + 0x7bc) & 0xdf;
      local_8[0x77] = (quicly_sent_t *)((long)&local_8[0x77]->acked + 1);
      local_314 = 0;
    }
  }
  ptls_buffer_dispose(in_stack_fffffffffffffa80);
  return local_314;
}

Assistant:

static int send_resumption_token(quicly_conn_t *conn, quicly_send_context_t *s)
{
    quicly_address_token_plaintext_t token;
    ptls_buffer_t tokenbuf;
    uint8_t tokenbuf_small[128];
    quicly_sent_t *sent;
    int ret;

    ptls_buffer_init(&tokenbuf, tokenbuf_small, sizeof(tokenbuf_small));

    /* build token */
    token =
        (quicly_address_token_plaintext_t){QUICLY_ADDRESS_TOKEN_TYPE_RESUMPTION, conn->super.ctx->now->cb(conn->super.ctx->now)};
    token.remote = conn->super.remote.address;
    /* TODO fill token.resumption */

    /* encrypt */
    if ((ret = conn->super.ctx->generate_resumption_token->cb(conn->super.ctx->generate_resumption_token, conn, &tokenbuf,
                                                              &token)) != 0)
        goto Exit;
    assert(tokenbuf.off < QUICLY_MIN_CLIENT_INITIAL_SIZE / 2 && "this is a ballpark figure, but tokens ought to be small");

    /* emit frame */
    if ((ret = allocate_ack_eliciting_frame(conn, s, quicly_new_token_frame_capacity(ptls_iovec_init(tokenbuf.base, tokenbuf.off)),
                                            &sent, on_ack_new_token)) != 0)
        goto Exit;
    ++conn->egress.new_token.num_inflight;
    sent->data.new_token.is_inflight = 1;
    sent->data.new_token.generation = conn->egress.new_token.generation;
    s->dst = quicly_encode_new_token_frame(s->dst, ptls_iovec_init(tokenbuf.base, tokenbuf.off));
    conn->egress.pending_flows &= ~QUICLY_PENDING_FLOW_NEW_TOKEN_BIT;

    ++conn->super.stats.num_frames_sent.new_token;
    QUICLY_PROBE(NEW_TOKEN_SEND, conn, conn->stash.now, tokenbuf.base, tokenbuf.off, sent->data.new_token.generation);
    ret = 0;
Exit:
    ptls_buffer_dispose(&tokenbuf);
    return ret;
}